

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiGetMemoryRequirements(aiScene *pIn,aiMemoryInfo *in)

{
  ScenePrivateData *pSVar1;
  undefined8 extraout_RAX;
  
  pSVar1 = Assimp::ScenePriv(pIn);
  if ((pSVar1 != (ScenePrivateData *)0x0) && (pSVar1->mOrigImporter != (Importer *)0x0)) {
    Assimp::Importer::GetMemoryRequirements(pSVar1->mOrigImporter,in);
    return;
  }
  ReportSceneNotFoundError();
  __cxa_begin_catch(extraout_RAX);
  __cxa_end_catch();
  return;
}

Assistant:

void aiGetMemoryRequirements(const C_STRUCT aiScene* pIn,
    C_STRUCT aiMemoryInfo* in)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // find the importer associated with this data
    const ScenePrivateData* priv = ScenePriv(pIn);
    if( !priv || !priv->mOrigImporter)  {
        ReportSceneNotFoundError();
        return;
    }

    return priv->mOrigImporter->GetMemoryRequirements(*in);
    ASSIMP_END_EXCEPTION_REGION(void);
}